

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O2

bool ON_IncreaseBezierDegree(int dim,bool is_rat,int order,int cv_stride,double *cv)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  undefined7 in_register_00000031;
  long lVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  iVar5 = dim + (int)CONCAT71(in_register_00000031,is_rat);
  lVar6 = (long)cv_stride;
  pdVar1 = cv + cv_stride * order;
  memcpy(pdVar1,pdVar1 + -lVar6,(long)iVar5 * 8);
  pdVar1 = pdVar1 + ~(cv_stride - iVar5);
  dVar7 = (double)order;
  pdVar2 = pdVar1 + -lVar6;
  dVar8 = 1.0 / dVar7;
  dVar9 = 0.0;
  while (order = order + -1, order != 0) {
    dVar7 = dVar7 + -1.0;
    dVar9 = dVar9 + 1.0;
    lVar3 = lVar6 * 8 + (long)iVar5 * -8;
    for (lVar4 = 0; -iVar5 != (int)lVar4; lVar4 = lVar4 + -1) {
      pdVar1[lVar4] = pdVar2[lVar4] * dVar8 * dVar7 + pdVar1[lVar4] * dVar8 * dVar9;
      lVar3 = lVar3 + 8;
    }
    pdVar2 = (double *)((long)pdVar2 - lVar3);
    pdVar1 = (double *)((long)pdVar1 - lVar3);
  }
  return true;
}

Assistant:

bool ON_IncreaseBezierDegree(
        int     dim, 
        bool    is_rat, 
        int     order, 
        int     cv_stride,
        double* cv 
        )
/*****************************************************************************
Increase the degree of a Bezier
 
INPUT:
  cvdim (dim + is_rat)
  order ( >= 2 )
    order of input bezier
  cv            
    control vertices of bezier
  newcv    
    array of cvdim*(order+1) doubles (The cv and newcv pointers may be equal.)
OUTPUT:
  newcv  Control vertices of an Bezier with order (order+1).  The new Bezier
         and the old Bezier evaluate to the same point.  
COMMENTS:
  If {B_0, ... B_d} are the control vertices of the input Bezier, then
  {C_0, ..., C_{d+1}} are the control vertices of the returned Bezier, 
  where,
    C_0     = B_0
    C_k     = k/(d+1) * B_{k-1}  +  (d+1-k)/(d+1) * B_{k}(1 < k <= d)
    C_{d+1} = B_d
  The computation is done in a way that permits the pointers cv and newcv
  to be equal; i.e., if the cv array is long enough, the degree may be
  raised with a call like
    TL_IncreaseBezierDegree(cvdim,order,cv,cv);
EXAMPLE:
  raise_degree(TL_BEZIER* bez)
  {  
    // raise the degree of a TL_BEZIER
    bez->cv = (double*) onrealloc ( bez->cv, (bez->order+1)*(bez->dim+bez->is_rat) );
    TL_IncreaseBezierDegree ( bez->dim+bez->is_rat, bez->order,bez->cv,bez->cv );
    bez->order++;
  }
REFERENCE:
  BOHM-01, Page 7.
RELATED FUNCTIONS:
  TL_DecreaseBezierDegree
*****************************************************************************/
{
  double a0, a1, d, c0, c1; 
  int j;
  double* newcv = cv;
  const int cvdim = (is_rat)?dim+1:dim;
  const int dcv = cv_stride - cvdim;


  j = cv_stride*order;
  newcv += j;
  memcpy( newcv, newcv-cv_stride, cvdim*sizeof(*newcv) );
  newcv -= (dcv+1);
  cv = newcv - cv_stride;
  a0 = order;
  a1 = 0.0;
  d = 1.0/a0;
  while (--order) {
    a0 -= 1.0;
    a1 += 1.0;
    c0 = d*a0;
    c1 = d*a1;
    j = cvdim;
    while(j--) {
      *newcv = c0 * *cv + c1 * *newcv; 
      cv--; 
      newcv--;
    }
    cv -= dcv;
    newcv -= dcv;
  }
  return true;
}